

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O2

void test_2d_static<5ul,5ul,30ul,30ul>(void)

{
  int iVar1;
  undefined4 uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  int i_1;
  long lVar7;
  unsigned_long *puVar8;
  unsigned_long *local_1380;
  size_t true_idx;
  unsigned_long *local_1370;
  int *local_1368;
  unsigned_long *local_1360;
  int dptr [1225];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x4c9;
  dptr[1] = 0;
  true_idx = 0x4c9;
  puVar6 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",puVar6,&true_idx);
  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
    local_1370 = puVar6;
    for (lVar7 = 0; lVar7 != 0x41a; lVar7 = lVar7 + 0x23) {
      local_1380 = (unsigned_long *)(lVar7 + lVar3);
      true_idx = (size_t)local_1380;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_1380,&true_idx);
      local_1368 = dptr + true_idx;
      local_1380 = puVar6;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (int **)&local_1380,&local_1368);
      *(undefined4 *)puVar6 = 0x2a;
      local_1380 = (unsigned_long *)CONCAT44(local_1380._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",(int *)puVar6,
                 (int *)&local_1380);
      puVar6 = (unsigned_long *)((long)puVar6 + 0x8c);
    }
    puVar6 = (unsigned_long *)((long)local_1370 + 4);
  }
  puVar6 = (unsigned_long *)dptr;
  puVar8 = (unsigned_long *)0x0;
  do {
    if (puVar8 == (unsigned_long *)&DAT_00000023) {
      puVar6 = (unsigned_long *)dptr;
      puVar8 = (unsigned_long *)0x0;
      while (puVar8 != (unsigned_long *)&DAT_00000023) {
        local_1370 = puVar8;
        local_1360 = puVar6;
        for (uVar4 = 0; uVar4 != 0x23; uVar4 = uVar4 + 1) {
          local_1380 = puVar8;
          true_idx = (size_t)puVar8;
          boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                    ("(l.index(i, j))","true_idx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x57,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (unsigned_long *)&local_1380,&true_idx);
          local_1368 = dptr + true_idx;
          local_1380 = puVar6;
          boost::detail::test_eq_impl<int*,int*>
                    ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x59,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int **)&local_1380,&local_1368);
          if (uVar4 < 0x1e) {
            if (local_1370 < (unsigned_long *)0x1e) {
              local_1380 = (unsigned_long *)CONCAT44(local_1380._4_4_,0x2a);
              pcVar5 = "42";
              iVar1 = 0x6a;
            }
            else {
              local_1380 = (unsigned_long *)CONCAT44(local_1380._4_4_,0x18);
              pcVar5 = "24";
              iVar1 = 100;
            }
          }
          else {
            local_1380 = (unsigned_long *)CONCAT44(local_1380._4_4_,0x11);
            pcVar5 = "17";
            iVar1 = 0x5e;
          }
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])",pcVar5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,iVar1,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                     (int *)puVar6,(int *)&local_1380);
          puVar8 = (unsigned_long *)((long)puVar8 + 0x23);
          puVar6 = (unsigned_long *)((long)puVar6 + 0x8c);
        }
        puVar6 = (unsigned_long *)((long)local_1360 + 4);
        puVar8 = (unsigned_long *)((long)local_1370 + 1);
      }
      return;
    }
    local_1370 = puVar8;
    local_1360 = puVar6;
    for (uVar4 = 0; uVar4 != 0x23; uVar4 = uVar4 + 1) {
      local_1380 = puVar8;
      true_idx = (size_t)puVar8;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_1380,&true_idx);
      local_1368 = dptr + true_idx;
      local_1380 = puVar6;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                 (int **)&local_1380,&local_1368);
      if (uVar4 < 0x1e) {
        if ((unsigned_long *)0x1d < local_1370) {
          uVar2 = 0x18;
          *(int *)puVar6 = 0x18;
          pcVar5 = "24";
          iVar1 = 0x4d;
          goto LAB_0010476a;
        }
      }
      else {
        uVar2 = 0x11;
        *(int *)puVar6 = 0x11;
        pcVar5 = "17";
        iVar1 = 0x45;
LAB_0010476a:
        local_1380 = (unsigned_long *)CONCAT44(local_1380._4_4_,uVar2);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",pcVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,iVar1,"void test_2d_static() [N = 5UL, M = 5UL, X = 30UL, Y = 30UL]",
                   (int *)puVar6,(int *)&local_1380);
      }
      puVar8 = (unsigned_long *)((long)puVar8 + 0x23);
      puVar6 = (unsigned_long *)((long)puVar6 + 0x8c);
    }
    puVar8 = (unsigned_long *)((long)local_1370 + 1);
    puVar6 = (unsigned_long *)((long)local_1360 + 4);
  } while( true );
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}